

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03_signal_epoll.c
# Opt level: O0

void copy_fd(int in,int out)

{
  ssize_t sVar1;
  size_t __n;
  char local_418 [4];
  int bytes_read;
  char buff [1024];
  int out_local;
  int in_local;
  
  memset(local_418,0,0x400);
  sVar1 = read(in,local_418,0x3ff);
  if ((int)sVar1 != -1) {
    if ((int)sVar1 != 0) {
      __n = strlen(local_418);
      write(out,local_418,__n);
    }
    return;
  }
  perror("read");
  exit(1);
}

Assistant:

void copy_fd(int in, int out) {
    char buff[1024];
    int bytes_read;

    bzero(buff, sizeof(buff));
    bytes_read = read(in, buff, sizeof(buff)-1 );
    if (bytes_read == -1)
        handle_error("read");
    else if (bytes_read == 0)
        return;
    write(out, buff, strlen(buff));
}